

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O3

string * __thiscall
Assimp::Ogre::OgreXmlSerializer::CurrentNodeName_abi_cxx11_
          (string *__return_storage_ptr__,OgreXmlSerializer *this,bool forceRead)

{
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  allocator local_39;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if ((int)CONCAT71(in_register_00000011,forceRead) != 0) {
    iVar2 = (*this->m_reader->_vptr_IIrrXMLReader[0xd])();
    std::__cxx11::string::string((string *)local_38,(char *)CONCAT44(extraout_var,iVar2),&local_39);
    std::__cxx11::string::operator=((string *)&this->m_currentNodeName,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->m_currentNodeName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->m_currentNodeName)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string OgreXmlSerializer::CurrentNodeName(bool forceRead)
{
    if (forceRead)
        m_currentNodeName = std::string(m_reader->getNodeName());
    return m_currentNodeName;
}